

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar5;
  Expr *pEVar3;
  Expr *pEVar4;
  uint uVar6;
  ExprList *pEVar7;
  Expr *pEVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  Expr *local_40;
  Expr *local_38;
  
  if (p == (ExprList *)0x0) {
    return (ExprList *)0x0;
  }
  if ((db != (sqlite3 *)0x0) && (p < (ExprList *)(db->lookaside).pTrueEnd)) {
    uVar6 = 0x80;
    if ((ExprList *)(db->lookaside).pMiddle <= p) goto LAB_00171487;
    if ((ExprList *)(db->lookaside).pStart <= p) {
      uVar6 = (uint)(db->lookaside).szTrue;
      goto LAB_00171487;
    }
  }
  uVar6 = (*sqlite3Config.m.xSize)(p);
LAB_00171487:
  pEVar7 = (ExprList *)sqlite3DbMallocRawNN(db,(long)(int)uVar6);
  if (pEVar7 == (ExprList *)0x0) {
    return (ExprList *)0x0;
  }
  uVar2 = p->nExpr;
  uVar5 = p->nAlloc;
  pEVar7->nExpr = uVar2;
  pEVar7->nAlloc = uVar5;
  if (0 < (int)uVar2) {
    local_40 = (Expr *)0x0;
    lVar10 = 8;
    local_38 = (Expr *)0x0;
    iVar11 = 0;
    do {
      pEVar3 = *(Expr **)((long)p->a + lVar10 + -8);
      if (pEVar3 == (Expr *)0x0) {
        *(undefined8 *)((long)pEVar7->a + lVar10 + -8) = 0;
      }
      else {
        pEVar8 = exprDup(db,pEVar3,flags,(EdupBuf *)0x0);
        *(Expr **)((long)pEVar7->a + lVar10 + -8) = pEVar8;
        if (pEVar8 != (Expr *)0x0 && pEVar3->op == 0xb2) {
          pEVar4 = pEVar8->pRight;
          if (pEVar4 == (Expr *)0x0) {
            pEVar3 = pEVar3->pLeft;
            if (pEVar3 != local_38) {
              if (pEVar3 == (Expr *)0x0) {
                local_40 = (Expr *)0x0;
              }
              else {
                local_40 = exprDup(db,pEVar3,flags,(EdupBuf *)0x0);
              }
              pEVar8->pRight = local_40;
              local_38 = pEVar3;
            }
            pEVar8->pLeft = local_40;
          }
          else {
            local_38 = pEVar3->pRight;
            pEVar8->pLeft = pEVar4;
            local_40 = pEVar4;
          }
        }
      }
      pcVar9 = sqlite3DbStrDup(db,*(char **)((long)&p->a[0].pExpr + lVar10));
      *(char **)((long)&pEVar7->a[0].pExpr + lVar10) = pcVar9;
      uVar1 = *(undefined4 *)((long)&p->a[0].zEName + lVar10);
      *(undefined4 *)((long)&pEVar7->a[0].zEName + lVar10) = uVar1;
      *(ushort *)((long)&pEVar7->a[0].zEName + lVar10 + 1) = (ushort)((uint)uVar1 >> 8) & 0xfffb;
      *(undefined4 *)((long)&pEVar7->a[0].zEName + lVar10 + 4) =
           *(undefined4 *)((long)&p->a[0].zEName + lVar10 + 4);
      iVar11 = iVar11 + 1;
      lVar10 = lVar10 + 0x18;
    } while (iVar11 < p->nExpr);
    return pEVar7;
  }
  return pEVar7;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, const ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem;
  const struct ExprList_item *pOldItem;
  int i;
  Expr *pPriorSelectColOld = 0;
  Expr *pPriorSelectColNew = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pNew->nAlloc = p->nAlloc;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0
    ){
      if( pNewExpr->pRight ){
        pPriorSelectColOld = pOldExpr->pRight;
        pPriorSelectColNew = pNewExpr->pRight;
        pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        if( pOldExpr->pLeft!=pPriorSelectColOld ){
          pPriorSelectColOld = pOldExpr->pLeft;
          pPriorSelectColNew = sqlite3ExprDup(db, pPriorSelectColOld, flags);
          pNewExpr->pRight = pPriorSelectColNew;
        }
        pNewExpr->pLeft = pPriorSelectColNew;
      }
    }
    pItem->zEName = sqlite3DbStrDup(db, pOldItem->zEName);
    pItem->fg = pOldItem->fg;
    pItem->fg.done = 0;
    pItem->u = pOldItem->u;
  }
  return pNew;
}